

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

void __thiscall mjs::value::destroy(value *this)

{
  wostream *os;
  wstring local_1c8 [32];
  wstring_view local_1a8 [2];
  wostringstream local_188 [8];
  wostringstream _woss;
  value *this_local;
  
  switch(this->type_) {
  case undefined:
    break;
  case null:
    break;
  case boolean:
    break;
  case number:
    break;
  case string:
    string::~string(&(this->field_1).s_);
    break;
  case object:
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)&(this->field_1).s_);
    break;
  case reference:
    reference::~reference(&(this->field_1).r_);
    break;
  default:
    std::__cxx11::wostringstream::wostringstream(local_188);
    os = std::operator<<((wostream *)local_188,"Not implemented: ");
    mjs::operator<<(os,this->type_);
    std::__cxx11::wostringstream::str();
    local_1a8[0] = (wstring_view)
                   std::__cxx11::wstring::operator_cast_to_basic_string_view(local_1c8);
    throw_runtime_error(local_1a8,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                        ,0x52);
  }
  this->type_ = undefined;
  return;
}

Assistant:

void value::destroy() {
    switch (type_) {
    case value_type::undefined: break;
    case value_type::null: break;
    case value_type::boolean: break;
    case value_type::number: break;
    case value_type::string: s_.~string(); break;
    case value_type::object: o_.~gc_heap_ptr(); break;
    case value_type::reference: r_.~reference(); break;
    default: NOT_IMPLEMENTED(type_);
    }
    type_ = value_type::undefined;
}